

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowererMDArch.cpp
# Opt level: O1

BranchInstr * __thiscall
LowererMDArch::InsertMissingItemCompareBranch
          (LowererMDArch *this,Opnd *compareSrc,Opnd *missingItemOpnd,OpCode opcode,
          LabelInstr *target,Instr *insertBeforeInstr)

{
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  undefined4 *puVar4;
  RegOpnd *dst;
  BranchInstr *pBVar5;
  
  if ((compareSrc->m_type != TyFloat64) || (missingItemOpnd->m_type != TyUint64)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0xd9e,"(compareSrc->IsFloat64() && missingItemOpnd->IsUint64())",
                       "compareSrc->IsFloat64() && missingItemOpnd->IsUint64()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  dst = IR::RegOpnd::New(TyUint64,this->m_func);
  OVar3 = IR::Opnd::GetKind(compareSrc);
  if (OVar3 == OpndKindReg) {
    LowererMD::EmitReinterpretPrimitive
              (this->lowererMD,&dst->super_Opnd,compareSrc,insertBeforeInstr);
  }
  else {
    OVar3 = IR::Opnd::GetKind(compareSrc);
    if (OVar3 == OpndKindIndir) {
      dst = (RegOpnd *)IR::Opnd::UseWithNewType(compareSrc,TyUint64,this->m_func);
    }
  }
  pBVar5 = Lowerer::InsertCompareBranch
                     (this->lowererMD->m_lowerer,missingItemOpnd,&dst->super_Opnd,opcode,target,
                      insertBeforeInstr,false);
  return pBVar5;
}

Assistant:

IR::BranchInstr*
LowererMDArch::InsertMissingItemCompareBranch(IR::Opnd* compareSrc, IR::Opnd* missingItemOpnd, Js::OpCode opcode, IR::LabelInstr* target, IR::Instr* insertBeforeInstr)
{
    Assert(compareSrc->IsFloat64() && missingItemOpnd->IsUint64());

    IR::Opnd * compareSrcUint64Opnd = IR::RegOpnd::New(TyUint64, m_func);

    if (compareSrc->IsRegOpnd())
    {
        this->lowererMD->EmitReinterpretPrimitive(compareSrcUint64Opnd, compareSrc, insertBeforeInstr);
    }
    else if (compareSrc->IsIndirOpnd())
    {
        compareSrcUint64Opnd = compareSrc->UseWithNewType(TyUint64, m_func);
    }

    return this->lowererMD->m_lowerer->InsertCompareBranch(missingItemOpnd, compareSrcUint64Opnd, opcode, target, insertBeforeInstr);
}